

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool xemmai::t_type_of<xemmai::t_string>::f__equals(t_string *a_self,t_pvalue *a_value)

{
  bool bVar1;
  
  bVar1 = t_type_of<xemmai::t_object>::t_cast<xemmai::t_string>::f_is
                    ((a_value->super_t_pointer).v_p);
  if (bVar1) {
    bVar1 = t_string::operator==(a_self,(t_string *)((a_value->super_t_pointer).v_p)->v_data);
    return bVar1;
  }
  return false;
}

Assistant:

static bool f__equals(const t_string& a_self, const t_pvalue& a_value)
	{
		return f_is<t_string>(a_value) && a_self == a_value->f_as<t_string>();
	}